

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

word * Extra_NpnRead(char *pFileName,int nFuncs)

{
  int iVar1;
  word *pwVar2;
  FILE *__stream;
  char *pcVar3;
  char *local_b0;
  uint local_9c;
  char local_98;
  char local_97;
  char acStack_96 [2];
  int i;
  char pBuffer [100];
  word *pFuncs;
  FILE *pFile;
  int nFuncs_local;
  char *pFileName_local;
  
  local_9c = 0;
  pwVar2 = (word *)calloc((long)nFuncs,8);
  __stream = fopen(pFileName,"rb");
  while( true ) {
    pcVar3 = fgets(&local_98,100,__stream);
    if (pcVar3 == (char *)0x0) break;
    if (local_97 == 'x') {
      local_b0 = acStack_96;
    }
    else {
      local_b0 = &local_98;
    }
    Extra_ReadHex((uint *)(pwVar2 + (int)local_9c),local_b0,0x10);
    local_9c = local_9c + 1;
  }
  fclose(__stream);
  if (local_9c == nFuncs) {
    local_9c = 0;
    while( true ) {
      iVar1 = Abc_MinInt(nFuncs,10);
      if (iVar1 <= (int)local_9c) break;
      printf("Line %d : ",(ulong)local_9c);
      Extra_PrintHex(_stdout,(uint *)(pwVar2 + (int)local_9c),6);
      printf("\n");
      local_9c = local_9c + 1;
    }
    return pwVar2;
  }
  __assert_fail("i == nFuncs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0x976,"word *Extra_NpnRead(char *, int)");
}

Assistant:

word * Extra_NpnRead( char * pFileName, int nFuncs )
{
    FILE * pFile;
    word * pFuncs;
    char pBuffer[100];
    int i = 0;
    pFuncs = ABC_CALLOC( word, nFuncs );
    pFile = fopen( pFileName, "rb" );
    while ( fgets( pBuffer, 100, pFile ) )
        Extra_ReadHex( (unsigned *)(pFuncs + i++), (pBuffer[1] == 'x' ? pBuffer+2 : pBuffer), 16 );
    fclose( pFile );
    assert( i == nFuncs );
    for ( i = 0; i < Abc_MinInt(nFuncs, 10); i++ )
    {
        printf( "Line %d : ", i );
        Extra_PrintHex( stdout, (unsigned *)(pFuncs + i), 6 ), printf( "\n" );
    }
    return pFuncs;
}